

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O2

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _h;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int k;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int i;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  void *pvVar18;
  int j;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  Mat square_sum;
  Mat m;
  Mat square_blob;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar20 = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  uVar21 = bottom_top_blob->c;
  sVar2 = bottom_top_blob->elemsize;
  square_blob.elemsize._0_4_ = 0;
  square_blob.elemsize._4_4_ = 0;
  square_blob.packing = 0;
  square_blob.data = (void *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.allocator = (Allocator *)0x0;
  square_blob.dims = 0;
  square_blob.w = 0;
  square_blob.h = 0;
  square_blob.c = 0;
  square_blob.cstep = 0;
  Mat::create(&square_blob,uVar20,_h,uVar21,sVar2,opt->workspace_allocator);
  iVar8 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_00126af7;
  uVar22 = 0;
  uVar23 = (ulong)(_h * uVar20);
  if ((int)(_h * uVar20) < 1) {
    uVar23 = uVar22;
  }
  uVar5 = 0;
  if (0 < (int)uVar21) {
    uVar5 = (ulong)uVar21;
  }
  for (; uVar22 != uVar5; uVar22 = uVar22 + 1) {
    Mat::channel(&square_sum,bottom_top_blob,(int)uVar22);
    pvVar13 = square_sum.data;
    Mat::~Mat(&square_sum);
    sVar3 = square_blob.cstep;
    pvVar18 = square_blob.data;
    lVar7 = CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize);
    square_sum.data = (void *)(square_blob.cstep * uVar22 * lVar7 + (long)square_blob.data);
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.packing = square_blob.packing;
    square_sum.allocator = square_blob.allocator;
    square_sum.w = square_blob.w;
    square_sum.dims = 2;
    square_sum.c = 1;
    square_sum.h = square_blob.h;
    square_sum.cstep = (size_t)(square_blob.h * square_blob.w);
    Mat::~Mat(&square_sum);
    for (uVar6 = 0; uVar23 != uVar6; uVar6 = uVar6 + 1) {
      fVar1 = *(float *)((long)pvVar13 + uVar6 * 4);
      *(float *)((long)pvVar18 + uVar6 * 4 + sVar3 * lVar7 * uVar22) = fVar1 * fVar1;
    }
  }
  if (this->region_type == 0) {
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.packing = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.c = 0;
    square_sum.cstep = 0;
    Mat::create(&square_sum,uVar20,_h,uVar21,sVar2,opt->workspace_allocator);
    if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0)) {
LAB_00126ae9:
      Mat::~Mat(&square_sum);
      iVar8 = -100;
      goto LAB_00126af7;
    }
    Mat::fill(&square_sum,0.0);
    iVar8 = this->local_size;
    fVar1 = this->alpha;
    for (uVar22 = 0; sVar2 = square_sum.cstep, pvVar13 = square_sum.data, uVar22 != uVar5;
        uVar22 = uVar22 + 1) {
      sVar3 = CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      m.data = (void *)(square_sum.cstep * uVar22 * sVar3 + (long)square_sum.data);
      m.refcount = (int *)0x0;
      m.packing = square_sum.packing;
      m.allocator = square_sum.allocator;
      m.dims = 2;
      m.w = square_sum.w;
      m.h = square_sum.h;
      m.c = 1;
      m.cstep = (size_t)(square_sum.h * square_sum.w);
      m.elemsize = sVar3;
      Mat::~Mat(&m);
      iVar11 = this->local_size;
      iVar12 = (int)uVar22;
      lVar7 = sVar2 * sVar3 * uVar22;
      for (uVar20 = iVar11 / -2 + iVar12; sVar2 = square_blob.cstep, pvVar18 = square_blob.data,
          (int)uVar20 <= iVar11 / 2 + iVar12; uVar20 = uVar20 + 1) {
        if ((int)uVar20 < (int)uVar21 && -1 < (int)uVar20) {
          sVar3 = CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize);
          m.data = (void *)(square_blob.cstep * uVar20 * sVar3 + (long)square_blob.data);
          m.refcount = (int *)0x0;
          m.packing = square_blob.packing;
          m.allocator = square_blob.allocator;
          m.dims = 2;
          m.w = square_blob.w;
          m.h = square_blob.h;
          m.c = 1;
          m.cstep = (size_t)(square_blob.h * square_blob.w);
          m.elemsize = sVar3;
          Mat::~Mat(&m);
          for (uVar6 = 0; uVar23 != uVar6; uVar6 = uVar6 + 1) {
            *(float *)((long)pvVar13 + uVar6 * 4 + lVar7) =
                 *(float *)((long)pvVar13 + uVar6 * 4 + lVar7) +
                 *(float *)((long)pvVar18 + uVar6 * 4 + sVar2 * sVar3 * (ulong)uVar20);
          }
          iVar11 = this->local_size;
        }
      }
      Mat::channel(&m,bottom_top_blob,iVar12);
      pvVar18 = m.data;
      Mat::~Mat(&m);
      for (uVar6 = 0; uVar23 != uVar6; uVar6 = uVar6 + 1) {
        fVar24 = powf(*(float *)((long)pvVar13 + uVar6 * 4 + lVar7) * fVar1 * (1.0 / (float)iVar8) +
                      this->bias,-this->beta);
        *(float *)((long)pvVar18 + uVar6 * 4) = fVar24 * *(float *)((long)pvVar18 + uVar6 * 4);
      }
    }
  }
  else {
    iVar8 = 0;
    if (this->region_type != 1) goto LAB_00126af7;
    piVar4 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = square_blob.refcount._0_4_;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.packing = square_blob.packing;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    uVar21 = this->local_size;
    uVar10 = uVar20;
    if (1 < (int)uVar21) {
      uVar10 = uVar21 >> 1;
      copy_make_border(&square_blob,&square_sum,uVar10,~uVar10 + uVar21,uVar10,~uVar10 + uVar21,0,
                       0.0,opt->workspace_allocator,opt->num_threads);
      if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0))
      goto LAB_00126ae9;
      uVar21 = this->local_size;
      uVar10 = square_sum.w;
    }
    uVar21 = uVar21 * uVar21;
    fVar1 = this->alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar21,(allocator_type *)&m);
    iVar8 = this->local_size;
    iVar12 = uVar10 - iVar8;
    lVar7 = 0;
    iVar11 = 0;
    for (iVar15 = 0; iVar15 < iVar8; iVar15 = iVar15 + 1) {
      for (lVar17 = 0; iVar16 = (int)lVar17, iVar16 < iVar8; lVar17 = lVar17 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar7 + lVar17] = iVar11 + iVar16;
        iVar8 = this->local_size;
      }
      iVar11 = iVar11 + iVar12 + iVar16;
      lVar7 = (int)lVar7 + lVar17;
    }
    uVar22 = 0;
    uVar23 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar23 = uVar22;
    }
    uVar6 = (ulong)_h;
    if ((int)_h < 1) {
      uVar6 = uVar22;
    }
    for (; uVar22 != uVar5; uVar22 = uVar22 + 1) {
      Mat::channel(&m,bottom_top_blob,(int)uVar22);
      pvVar13 = m.data;
      Mat::~Mat(&m);
      m.elemsize = CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      pvVar18 = (void *)(square_sum.cstep * uVar22 * m.elemsize + (long)square_sum.data);
      m.refcount = (int *)0x0;
      m.packing = square_sum.packing;
      m.allocator = square_sum.allocator;
      m.dims = 2;
      m.w = square_sum.w;
      m.h = square_sum.h;
      m.c = 1;
      m.cstep = (size_t)(square_sum.h * square_sum.w);
      lVar7 = m.elemsize * (long)square_sum.w;
      m.data = pvVar18;
      for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
        for (uVar19 = 0; uVar19 != uVar23; uVar19 = uVar19 + 1) {
          fVar24 = 0.0;
          for (uVar9 = 0; uVar21 != uVar9; uVar9 = uVar9 + 1) {
            fVar24 = fVar24 + *(float *)((long)pvVar18 +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar9] * 4 +
                                        uVar19 * 4 + uVar14 * lVar7);
          }
          fVar24 = powf(fVar24 * fVar1 * (1.0 / (float)(int)uVar21) + this->bias,-this->beta);
          *(float *)((long)pvVar13 + uVar19 * 4) = fVar24 * *(float *)((long)pvVar13 + uVar19 * 4);
        }
        pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar20 * 4);
      }
      Mat::~Mat(&m);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&square_sum);
  iVar8 = 0;
LAB_00126af7:
  Mat::~Mat(&square_blob);
  return iVar8;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}